

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::timestamp_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::timestamp_t,_int> *source,
               ArgMinMaxState<duckdb::timestamp_t,_int> *target,AggregateInputData *param_3)

{
  bool bVar1;
  int *in_RDX;
  byte *in_RSI;
  timestamp_t *in_RDI;
  
  if (((in_RDI->value & 1) != 0) &&
     (((*in_RSI & 1) == 0 || (bVar1 = LessThan::Operation<int>((int *)in_RSI,in_RDX), bVar1)))) {
    Assign<duckdb::timestamp_t,int,duckdb::ArgMinMaxState<duckdb::timestamp_t,int>>
              ((ArgMinMaxState<duckdb::timestamp_t,_int> *)param_3,in_RDI,(int *)in_RSI,
               SUB81((ulong)in_RDX >> 0x38,0));
    *in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}